

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

TestPreset * __thiscall
cmake::FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
          (cmake *this,static_string_view type,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          *presets,WorkflowStep *step)

{
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  TestPreset *pTVar4;
  char local_e9;
  string local_e8;
  string local_c8;
  char local_a1;
  string local_a0;
  char local_69;
  string local_68;
  _Self local_48;
  _Self local_40;
  const_iterator it;
  WorkflowStep *step_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *presets_local;
  cmake *this_local;
  static_string_view type_local;
  
  type_local.super_string_view._M_len = (size_t)type.super_string_view._M_str;
  this_local = (cmake *)type.super_string_view._M_len;
  it._M_node = (_Base_ptr)step;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
       ::find(presets,&step->PresetName);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
       ::end(presets);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    local_69 = '\"';
    cmStrCat<char_const(&)[9],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
              (&local_68,(char (*) [9])"No such ",(static_string_view *)&this_local,
               (char (*) [12])0x1135085,psVar3,(char (*) [4])0x115e689,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(it._M_node)->_M_parent,&local_69);
    cmSystemTools::Error(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    type_local.super_string_view._M_str = (char *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
             ::operator->(&local_40);
    if (((ppVar2->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
               ::operator->(&local_40);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&(ppVar2->second).Expanded);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
                 ::operator->(&local_40);
        pTVar4 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->
                           (&(ppVar2->second).Expanded);
        if (((pTVar4->super_Preset).ConditionResult & 1U) == 0) {
          psVar3 = GetHomeDirectory_abi_cxx11_(this);
          local_e9 = '\"';
          cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                    (&local_e8,(char (*) [21])"Cannot use disabled ",
                     (static_string_view *)&this_local,(char (*) [12])0x1135085,psVar3,
                     (char (*) [4])0x115e689,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(it._M_node)->_M_parent,&local_e9);
          cmSystemTools::Error(&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          type_local.super_string_view._M_str = (char *)0x0;
        }
        else {
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
                   ::operator->(&local_40);
          type_local.super_string_view._M_str =
               (char *)std::optional<cmCMakePresetsGraph::TestPreset>::operator*
                                 (&(ppVar2->second).Expanded);
        }
      }
      else {
        cmStrCat<char_const(&)[20],cm::static_string_view&,char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27]>
                  (&local_c8,(char (*) [20])"Could not evaluate ",(static_string_view *)&this_local,
                   (char (*) [10])0x1133ec6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(it._M_node)->_M_parent,(char (*) [27])"\": Invalid macro expansion");
        cmSystemTools::Error(&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        type_local.super_string_view._M_str = (char *)0x0;
      }
    }
    else {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      local_a1 = '\"';
      cmStrCat<char_const(&)[19],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                (&local_a0,(char (*) [19])"Cannot use hidden ",(static_string_view *)&this_local,
                 (char (*) [12])0x1135085,psVar3,(char (*) [4])0x115e689,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(it._M_node)->_M_parent,&local_a1);
      cmSystemTools::Error(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      type_local.super_string_view._M_str = (char *)0x0;
    }
  }
  return (TestPreset *)type_local.super_string_view._M_str;
}

Assistant:

const T* cmake::FindPresetForWorkflow(
  cm::static_string_view type,
  const std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph::WorkflowPreset::WorkflowStep& step)
{
  auto it = presets.find(step.PresetName);
  if (it == presets.end()) {
    cmSystemTools::Error(cmStrCat("No such ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (it->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (!it->second.Expanded) {
    cmSystemTools::Error(cmStrCat("Could not evaluate ", type, " preset \"",
                                  step.PresetName,
                                  "\": Invalid macro expansion"));
    return nullptr;
  }

  if (!it->second.Expanded->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  return &*it->second.Expanded;
}